

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateModuleGlobalVariableInformation(ExpressionTranslateContext *ctx)

{
  VariableData *variable;
  ScopeData *pSVar1;
  ulong uVar2;
  ExpressionContext *this;
  
  PrintIndentedLine(ctx,"// Register globals");
  this = ctx->ctx;
  if ((this->variables).count != 0) {
    uVar2 = 0;
    do {
      variable = (this->variables).data[uVar2];
      if ((variable->isVmAlloca == false) && (variable->importModule == (ModuleData *)0x0)) {
        pSVar1 = variable->scope;
        if ((pSVar1 != this->globalScope) && (pSVar1->ownerNamespace == (NamespaceData *)0x0)) {
          pSVar1 = ExpressionContext::GlobalScopeFrom(this,pSVar1);
          if (pSVar1 == (ScopeData *)0x0) goto LAB_001467e5;
        }
        PrintIndent(ctx);
        Print(ctx,"__nullcRegisterGlobal((void*)&");
        TranslateVariableName(ctx,variable);
        Print(ctx,", __nullcTR[%d]);",(ulong)variable->type->typeIndex);
        OutputContext::Print(ctx->output,"\n",1);
      }
LAB_001467e5:
      uVar2 = uVar2 + 1;
      this = ctx->ctx;
    } while (uVar2 < (this->variables).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleGlobalVariableInformation(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Register globals");

	for(unsigned int i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		// Don't need variables allocated by intermediate vm compilation
		if(variable->isVmAlloca)
			continue;

		if(variable->importModule)
			continue;

		if(variable->scope == ctx.ctx.globalScope || variable->scope->ownerNamespace || ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterGlobal((void*)&");
			TranslateVariableName(ctx, variable);
			Print(ctx, ", __nullcTR[%d]);", variable->type->typeIndex);
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}